

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileMtlImporter::getIlluminationModel(ObjFileMtlImporter *this,int *illum_model)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar6 = (this->m_DataIt)._M_current;
  pcVar4 = (this->m_DataItEnd)._M_current;
  pcVar1 = pcVar4 + -1;
  if (pcVar1 != pcVar6 && pcVar6 != pcVar4) {
    do {
      if (((*pcVar6 != ' ') && (*pcVar6 != '\t')) || (pcVar6 = pcVar6 + 1, pcVar6 == pcVar4)) break;
    } while (pcVar6 != pcVar1);
  }
  lVar7 = 0;
  while( true ) {
    pcVar2 = pcVar6 + lVar7;
    bVar3 = pcVar6[lVar7];
    if ((((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
       ((pcVar2 == pcVar4 || (pcVar2 == pcVar1)))) goto LAB_0068ae2a;
    this->m_buffer[lVar7] = bVar3;
    if (lVar7 == 0x7fe) break;
    lVar7 = lVar7 + 1;
  }
  lVar7 = 0x7ff;
LAB_0068ae2a:
  this->m_buffer[lVar7] = '\0';
  (this->m_DataIt)._M_current = pcVar2;
  iVar5 = atoi(this->m_buffer);
  *illum_model = iVar5;
  return;
}

Assistant:

void ObjFileMtlImporter::getIlluminationModel( int &illum_model )
{
    m_DataIt = CopyNextWord<DataArrayIt>( m_DataIt, m_DataItEnd, m_buffer, BUFFERSIZE );
    illum_model = atoi(m_buffer);
}